

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotations.cpp
# Opt level: O2

SubFrame * __thiscall ezc3d::DataNS::RotationNS::Rotations::subframe(Rotations *this,size_t idx)

{
  reference pvVar1;
  
  pvVar1 = std::
           vector<ezc3d::DataNS::RotationNS::SubFrame,_std::allocator<ezc3d::DataNS::RotationNS::SubFrame>_>
           ::at(&this->_subframe,idx);
  return pvVar1;
}

Assistant:

ezc3d::DataNS::RotationNS::SubFrame &
ezc3d::DataNS::RotationNS::Rotations::subframe(size_t idx) {
  try {
    return _subframe.at(idx);
  } catch (const std::out_of_range&) {
    throw std::out_of_range(
        "Analogs::subframe method is trying to access the subframe " +
        std::to_string(idx) + " while the maximum number of subframes is " +
        std::to_string(nbSubframes()) + ".");
  }
}